

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O1

int4 __thiscall ParamEntry::getSlot(ParamEntry *this,Address *addr,int4 skip)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = this->group;
  if (this->alignment == 0) {
    if (skip != 0) {
      iVar2 = iVar2 + this->groupsize + -1;
    }
  }
  else {
    uVar1 = ((skip + (int)addr->offset) - (int)this->addressbase) / this->alignment;
    uVar3 = ~uVar1 + this->numslots;
    if ((this->flags & 2) == 0) {
      uVar3 = uVar1;
    }
    iVar2 = iVar2 + uVar3;
  }
  return iVar2;
}

Assistant:

int4 ParamEntry::getSlot(const Address &addr,int4 skip) const

{
  int4 res = group;
  if (alignment != 0) {
    uintb diff = addr.getOffset() + skip - addressbase;
    int4 baseslot = (int4)diff / alignment;
    if (isReverseStack())
      res += (numslots -1) - baseslot;
    else
      res += baseslot;
  }
  else if (skip != 0) {
    res += (groupsize-1);
  }
  return res;
}